

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::IfNonePathDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,IfNonePathDeclarationSyntax *this,size_t index)

{
  Token token;
  PathDeclarationSyntax *node;
  SyntaxNode *local_50;
  size_t index_local;
  IfNonePathDeclarationSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (IfNonePathDeclarationSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    node = not_null<slang::syntax::PathDeclarationSyntax_*>::get(&this->path);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax IfNonePathDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return path.get();
        default: return nullptr;
    }
}